

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::VarDeclaration> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::VarDeclaration>(RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::VarDeclaration> sVar3;
  string local_48;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::VarDeclaration,std::allocator<MyCompiler::VarDeclaration>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,
             (VarDeclaration **)this,(allocator<MyCompiler::VarDeclaration> *)&local_48);
  if (in_RSI->sym == VAR) {
    nextSym(in_RSI);
  }
  while( true ) {
    piVar1 = this->stream;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_48);
    std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
              ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)(piVar1 + 0x48),
               (value_type *)local_48._M_dataplus._M_p);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
    if (in_RSI->sym != COMMA) break;
    nextSym(in_RSI);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"semicolon or comma expected","");
  except(in_RSI,SEMICOLON,&local_48);
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::VarDeclaration>)
         sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::VarDeclaration> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<VarDeclaration>();

    accept(SymbolType::VAR);
    do
        pResult->vIdent.push_back(*parse<Ident>());
    while (accept(SymbolType::COMMA));
    except(SymbolType::SEMICOLON, "semicolon or comma expected");

    return pResult;
}